

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::shortEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,SPxId *enterId,int nr,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *max,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxabs)

{
  uint *puVar1;
  double dVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pnVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar8;
  int iVar9;
  long lVar10;
  fpclass_type fVar11;
  ulong uVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  shortval;
  cpp_dec_float<50U,_int,_void> local_178;
  fpclass_type local_138;
  undefined4 uStack_134;
  undefined8 uStack_130;
  cpp_dec_float<50U,_int,_void> local_128;
  undefined1 local_e8 [16];
  uint local_d8 [3];
  undefined3 uStack_cb;
  uint local_c8 [3];
  bool local_bc;
  undefined8 local_b8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  _local_138 = CONCAT44(uStack_134,nr);
  peVar3 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar2 = peVar3->s_epsilon_multiplier;
  uVar12 = -(ulong)(dVar2 == 1.0);
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_68,
             (double)(~uVar12 & (ulong)(dVar2 * 1e-05) | uVar12 & 0x3ee4f8b588e368f1));
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pSVar7 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  iVar9 = pSVar7->theRep * (enterId->super_DataKey).info;
  if (iVar9 < 0) {
    if ((max->m_backend).fpclass != cpp_dec_float_NaN) {
      local_178.fpclass = cpp_dec_float_finite;
      local_178.prec_elem = 10;
      local_178.data._M_elems[0] = 0;
      local_178.data._M_elems[1] = 0;
      local_178.data._M_elems[2] = 0;
      local_178.data._M_elems[3] = 0;
      local_178.data._M_elems[4] = 0;
      local_178.data._M_elems[5] = 0;
      local_178.data._M_elems._24_5_ = 0;
      local_178.data._M_elems[7]._1_3_ = 0;
      local_178.data._M_elems._32_5_ = 0;
      local_178.data._M_elems[9]._1_3_ = 0;
      local_178.exp = 0;
      local_178.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_178,0.0);
      iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&max->m_backend,&local_178);
      if (iVar9 == 0) {
        return true;
      }
      pSVar7 = (this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
    }
    pUVar8 = pSVar7->theCoPvec;
  }
  else {
    if (iVar9 == 0) {
      return false;
    }
    if ((max->m_backend).fpclass != cpp_dec_float_NaN) {
      local_178.fpclass = cpp_dec_float_finite;
      local_178.prec_elem = 10;
      local_178.data._M_elems[0] = 0;
      local_178.data._M_elems[1] = 0;
      local_178.data._M_elems[2] = 0;
      local_178.data._M_elems[3] = 0;
      local_178.data._M_elems[4] = 0;
      local_178.data._M_elems[5] = 0;
      local_178.data._M_elems._24_5_ = 0;
      local_178.data._M_elems[7]._1_3_ = 0;
      local_178.data._M_elems._32_5_ = 0;
      local_178.data._M_elems[9]._1_3_ = 0;
      local_178.exp = 0;
      local_178.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_178,0.0);
      iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&max->m_backend,&local_178);
      if (iVar9 == 0) {
        return true;
      }
      pSVar7 = (this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
    }
    pUVar8 = pSVar7->thePvec;
  }
  lVar10 = (long)(int)local_138;
  pnVar4 = (pUVar8->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = *(undefined8 *)((long)&pnVar4[lVar10].m_backend.data + 0x20);
  local_178.data._M_elems._32_5_ = SUB85(uVar5,0);
  local_178.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
  local_178.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[lVar10].m_backend.data;
  local_178.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[lVar10].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar4[lVar10].m_backend.data + 0x10);
  local_178.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  uVar5 = *(undefined8 *)(puVar1 + 2);
  local_178.data._M_elems._24_5_ = SUB85(uVar5,0);
  local_178.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
  local_178.exp = pnVar4[lVar10].m_backend.exp;
  local_178.neg = pnVar4[lVar10].m_backend.neg;
  local_178.fpclass = pnVar4[lVar10].m_backend.fpclass;
  local_178.prec_elem = pnVar4[lVar10].m_backend.prec_elem;
  uStack_130 = 0;
  local_b8._0_4_ = cpp_dec_float_finite;
  local_b8._4_4_ = 10;
  local_e8 = (undefined1  [16])0x0;
  local_d8[0] = 0;
  local_d8[1] = 0;
  stack0xffffffffffffff30 = 0;
  uStack_cb = 0;
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_c8[2] = 0;
  local_bc = false;
  if ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
       *)local_e8 != maxabs) {
    local_c8._0_8_ = *(undefined8 *)((maxabs->m_backend).data._M_elems + 8);
    local_e8 = *(undefined1 (*) [16])(maxabs->m_backend).data._M_elems;
    local_d8._0_8_ = *(undefined8 *)((maxabs->m_backend).data._M_elems + 4);
    uVar5 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 6);
    stack0xffffffffffffff30 = (undefined5)uVar5;
    uStack_cb = (undefined3)((ulong)uVar5 >> 0x28);
    local_c8[2] = (maxabs->m_backend).exp;
    local_bc = (maxabs->m_backend).neg;
    local_b8._0_4_ = (maxabs->m_backend).fpclass;
    local_b8._4_4_ = (maxabs->m_backend).prec_elem;
  }
  _local_138 = local_178._48_8_;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            ((cpp_dec_float<50U,_int,_void> *)local_e8,&local_68);
  if (((local_138 != cpp_dec_float_NaN) && ((fpclass_type)local_b8 != cpp_dec_float_NaN)) &&
     (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&local_178,(cpp_dec_float<50U,_int,_void> *)local_e8), iVar9 < 0)) {
    local_a8.data._M_elems[7]._1_3_ = local_178.data._M_elems[7]._1_3_;
    local_a8.data._M_elems._24_5_ = local_178.data._M_elems._24_5_;
    local_a8.data._M_elems[0] = local_178.data._M_elems[0];
    local_a8.data._M_elems[1] = local_178.data._M_elems[1];
    uVar5 = local_a8.data._M_elems._0_8_;
    local_a8.data._M_elems[2] = local_178.data._M_elems[2];
    local_a8.data._M_elems[3] = local_178.data._M_elems[3];
    local_a8.data._M_elems[9]._1_3_ = local_178.data._M_elems[9]._1_3_;
    local_a8.data._M_elems._32_5_ = local_178.data._M_elems._32_5_;
    local_a8.data._M_elems[4] = local_178.data._M_elems[4];
    local_a8.data._M_elems[5] = local_178.data._M_elems[5];
    local_a8.exp = local_178.exp;
    local_a8.neg = local_178.neg;
    local_a8.fpclass = local_178.fpclass;
    local_a8.prec_elem = local_178.prec_elem;
    local_a8.data._M_elems[0] = local_178.data._M_elems[0];
    fVar11 = local_178.fpclass;
    if (local_a8.data._M_elems[0] != 0 || fVar11 != cpp_dec_float_finite) {
      local_a8.neg = (bool)(local_178.neg ^ 1);
    }
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 10;
    local_128.data._M_elems[0] = 0;
    local_128.data._M_elems[1] = 0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems._24_5_ = 0;
    local_128.data._M_elems[7]._1_3_ = 0;
    local_128.data._M_elems._32_5_ = 0;
    local_128.data._M_elems[9]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    if (&local_128 != &maxabs->m_backend) {
      uVar6 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 8);
      local_128.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_128.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_128.data._M_elems._0_8_ = *(undefined8 *)(maxabs->m_backend).data._M_elems;
      local_128.data._M_elems._8_8_ = *(undefined8 *)((maxabs->m_backend).data._M_elems + 2);
      local_128.data._M_elems._16_8_ = *(undefined8 *)((maxabs->m_backend).data._M_elems + 4);
      uVar6 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 6);
      local_128.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_128.exp = (maxabs->m_backend).exp;
      local_128.neg = (maxabs->m_backend).neg;
      local_128.fpclass = (maxabs->m_backend).fpclass;
      local_128.prec_elem = (maxabs->m_backend).prec_elem;
    }
    local_a8.data._M_elems._0_8_ = uVar5;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_128,&local_68)
    ;
    if (((fVar11 != cpp_dec_float_NaN) && (local_128.fpclass != cpp_dec_float_NaN)) &&
       (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_a8,&local_128), iVar9 < 0)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool SPxFastRT<R>::shortEnter(
   const SPxId& enterId,
   int nr,
   R max,
   R maxabs) const
{
   R shortval = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_SHORTVAL);

   if(this->thesolver->isCoId(enterId))
   {
      if(max != 0.0)
      {
         R x = this->thesolver->coPvec().delta()[nr];

         if(x < maxabs * shortval && -x < maxabs * shortval)
            return false;
      }

      return true;
   }
   else if(this->thesolver->isId(enterId))
   {
      if(max != 0.0)
      {
         R x = this->thesolver->pVec().delta()[nr];

         if(x < maxabs * shortval && -x < maxabs * shortval)
            return false;
      }

      return true;
   }

   return false;
}